

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.h
# Opt level: O3

pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* mp::ReadSOLFile<mp::NLW2_SOLHandler_C_Impl>
            (pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *name,NLW2_SOLHandler_C_Impl *solh,NLUtils *utl,
            int *p_internal_rv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  NLW2_SOLReadResultCode NVar4;
  long lVar5;
  NLInfo_C *pNVar6;
  NLInfo *pNVar7;
  byte bVar8;
  SOLReader2<mp::NLW2_SOLHandler_C_Impl> solr;
  NLHeader_C h_c;
  SOLReader2<mp::NLW2_SOLHandler_C_Impl> local_5c0;
  NLHeader_C local_140;
  
  bVar8 = 0;
  local_5c0.solh_ = solh;
  local_5c0.utils_ = utl;
  (*(solh->solh2_c_).Header)(&local_140,(solh->solh2_c_).p_user_data_);
  memcpy(&local_5c0.hdr_,&local_140,0xa8);
  pNVar6 = &local_140.nli;
  pNVar7 = &local_5c0.hdr_.super_NLInfo;
  for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
    iVar3 = pNVar6->num_ampl_options;
    (pNVar7->super_NLInfo_C).format = pNVar6->format;
    (pNVar7->super_NLInfo_C).num_ampl_options = iVar3;
    pNVar6 = (NLInfo_C *)((long)pNVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    pNVar7 = (NLInfo *)((long)pNVar7 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  paVar1 = &local_5c0.solve_msg_.field_2;
  local_5c0.solve_msg_._M_string_length = 0;
  local_5c0.solve_msg_.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_5c0.err_msg_.field_2;
  local_5c0.err_msg_._M_string_length = 0;
  local_5c0.err_msg_.field_2._M_local_buf[0] = '\0';
  local_5c0.internal_rv_ = 0;
  local_5c0.readresult_ = NLW2_SOLRead_Result_Not_Set;
  local_5c0.stub_ = (char *)0x0;
  local_5c0.bkind[0] = "ASCII";
  local_5c0.bkind[1] = "binary";
  local_5c0.Objno[0] = -2;
  local_5c0.Objno[1] = -2;
  local_5c0.objno = -2;
  local_5c0.solve_msg_._M_dataplus._M_p = (pointer)paVar1;
  local_5c0.err_msg_._M_dataplus._M_p = (pointer)paVar2;
  NVar4 = SOLReader2<mp::NLW2_SOLHandler_C_Impl>::ReadSOLFile(&local_5c0,name);
  if (p_internal_rv != (int *)0x0) {
    *p_internal_rv = local_5c0.internal_rv_;
  }
  __return_storage_ptr__->first = NVar4;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->second,local_5c0.err_msg_._M_dataplus._M_p,
             local_5c0.err_msg_._M_dataplus._M_p + local_5c0.err_msg_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0.err_msg_._M_dataplus._M_p != paVar2) {
    operator_delete(local_5c0.err_msg_._M_dataplus._M_p,
                    CONCAT71(local_5c0.err_msg_.field_2._M_allocated_capacity._1_7_,
                             local_5c0.err_msg_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0.solve_msg_._M_dataplus._M_p != paVar1) {
    operator_delete(local_5c0.solve_msg_._M_dataplus._M_p,
                    CONCAT71(local_5c0.solve_msg_.field_2._M_allocated_capacity._1_7_,
                             local_5c0.solve_msg_.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<NLW2_SOLReadResultCode, std::string>
ReadSOLFile(
    const std::string& name,
		SOLHandler& solh, NLUtils& utl, int* p_internal_rv=nullptr) {
  SOLReader2<SOLHandler> solr(solh, utl);
	auto res = solr.ReadSOLFile(name);
	if (p_internal_rv)
		*p_internal_rv = solr.internal_rv();
	return { res, solr.ErrorMessage(res) };
}